

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O3

char * eventClassName(Type t)

{
  if ((int)t < 0x5c) {
    if ((int)t < 0x3c) {
      switch(t) {
      case Timer:
        return "QTimerEvent";
      case MouseButtonPress:
      case MouseButtonRelease:
      case MouseButtonDblClick:
      case MouseMove:
        goto switchD_002c6a3d_caseD_ad;
      case KeyPress:
      case KeyRelease:
switchD_002c6a67_caseD_6:
        return "QKeyEvent";
      case FocusIn:
      case FocusOut:
      case FocusAboutToChange:
        return "QFocusEvent";
      case Enter:
        return "QEnterEvent";
      case Leave:
      case Create:
      case Destroy:
      case Quit:
      case ParentChange:
      case ThreadChange:
      case WindowActivate:
      case WindowDeactivate:
      case ShowToParent:
      case HideToParent:
      case WindowActivate|MouseButtonDblClick:
      case WindowActivate|MouseMove:
      case WindowActivate|KeyPress:
        break;
      case Paint:
        return "QPaintEvent";
      case Move:
        return "QMoveEvent";
      case Resize:
        return "QResizeEvent";
      case Show:
        return "QShowEvent";
      case Hide:
        return "QHideEvent";
      case Close:
        return "QCloseEvent";
      case Wheel:
        return "QWheelEvent";
      default:
        if (t == ShortcutOverride) goto switchD_002c6a67_caseD_6;
      }
    }
    else {
      switch(t) {
      case DragEnter:
        return "QDragEnterEvent";
      case DragMove:
        return "QDragMoveEvent";
      case DragLeave:
      case DragResponse:
      case DragResponse|Timer:
      case DragResponse|MouseButtonPress:
      case DragResponse|MouseButtonRelease:
      case ChildAdded|MouseButtonPress:
        break;
      case Drop:
        return "QDropEvent";
      case ChildAdded:
      case ChildPolished:
      case ChildRemoved:
        return "QChildEvent";
      default:
        if (t == InputMethod) {
          return "QInputMethodEvent";
        }
        if (t == TabletMove) goto switchD_002c6a3d_caseD_ab;
      }
    }
  }
  else {
    switch(t) {
    case WindowStateChange:
      return "QWindowStateChangeEvent";
    case ReadOnlyChange:
    case ReadOnlyChange|Timer:
    case WindowUnblocked|MouseButtonDblClick:
    case MouseTrackingChange:
    case WhatsThis:
    case WhatsThisClicked:
    case WhatsThisClicked|Timer:
    case ToolBarChange:
    case ApplicationActivate:
    case ApplicationDeactivate:
    case QueryWhatsThis:
    case EnterWhatsThisMode:
    case LeaveWhatsThisMode:
    case ZOrderChange:
    case HoverLeave|MouseButtonPress:
    case ParentAboutToChange:
    case WinEventAct:
    case WinEventAct|Timer:
    case WinEventAct|MouseButtonPress:
    case WinEventAct|MouseButtonRelease:
    case HoverLeave|FocusIn:
    case HoverLeave|FocusOut:
    case HoverLeave|Enter:
    case HoverLeave|Leave:
    case HoverLeave|Paint:
    case HoverLeave|Move:
    case HoverLeave|Resize:
    case HoverLeave|Create:
    case HoverLeave|Destroy:
    case HoverLeave|Show:
    case HoverLeave|Hide:
    case HoverLeave|Close:
    case HoverLeave|Quit:
    case HoverLeave|ParentChange:
    case HoverLeave|ThreadChange:
    case HoverLeave|FocusAboutToChange:
    case AcceptDropsChange:
    case AcceptDropsChange|Timer:
    case ZeroTimerEvent:
    case KeyboardLayoutChange:
    case DynamicPropertyChange:
      break;
    case ToolTip:
      return "QHelpEvent";
    case StatusTip:
      return "QStatusTipEvent";
    case ActionChanged:
    case ActionAdded:
    case ActionRemoved:
      return "QActionEvent";
    case FileOpen:
      return "QFileOpenEvent";
    case Shortcut:
      return "QShortcutEvent";
    case HoverEnter:
    case HoverLeave:
    case HoverMove:
      return "QHoverEvent";
    case GraphicsSceneMouseMove:
    case GraphicsSceneMousePress:
    case GraphicsSceneMouseRelease:
    case GraphicsSceneMouseDoubleClick:
      return "QGraphicsSceneMouseEvent";
    case GraphicsSceneContextMenu:
    case GraphicsSceneHoverEnter:
    case GraphicsSceneHoverMove:
    case GraphicsSceneHoverLeave:
    case GraphicsSceneHelp:
    case GraphicsSceneDragEnter:
    case GraphicsSceneDragMove:
    case GraphicsSceneDragLeave:
    case GraphicsSceneDrop:
    case GraphicsSceneWheel:
      return "QGraphicsSceneEvent";
    case TabletEnterProximity:
    case TabletLeaveProximity:
switchD_002c6a3d_caseD_ab:
      return "QTabletEvent";
    case NonClientAreaMouseMove:
    case NonClientAreaMouseButtonPress:
    case NonClientAreaMouseButtonRelease:
    case NonClientAreaMouseButtonDblClick:
switchD_002c6a3d_caseD_ad:
      return "QMouseEvent";
    default:
      switch(t) {
      case TouchBegin:
      case TouchUpdate:
      case TouchEnd:
        return "QTouchEvent";
      case NativeGesture:
        return "QNativeGestureEvent";
      case Gesture:
      case GestureOverride:
        return "QGestureEvent";
      case RequestSoftwareInputPanel:
      case CloseSoftwareInputPanel:
      case CloseSoftwareInputPanel|Timer:
      case WinIdChange:
      case Expose:
      case TouchCancel:
      case ThemeChange:
      case SockClose:
      case PlatformPanel:
      case StyleAnimationUpdate:
      case ApplicationStateChange:
      case WindowChangeInternal:
      case ScreenChangeInternal:
        break;
      case ScrollPrepare:
        return "QScrollPrepareEvent";
      case Scroll:
        return "QScrollEvent";
      case InputMethodQuery:
        return "QInputMethodQueryEvent";
      case OrientationChange:
        return "QScreenOrientationChangeEvent";
      case PlatformSurface:
        return "QPlatformSurfaceEvent";
      default:
        if (t - TabletPress < 2) goto switchD_002c6a3d_caseD_ab;
      }
    }
  }
  return "QEvent";
}

Assistant:

static const char *eventClassName(QEvent::Type t)
{
    switch (t) {
    case QEvent::ActionAdded:
    case QEvent::ActionRemoved:
    case QEvent::ActionChanged:
        return "QActionEvent";
    case QEvent::MouseButtonPress:
    case QEvent::MouseButtonRelease:
    case QEvent::MouseButtonDblClick:
    case QEvent::MouseMove:
    case QEvent::NonClientAreaMouseMove:
    case QEvent::NonClientAreaMouseButtonPress:
    case QEvent::NonClientAreaMouseButtonRelease:
    case QEvent::NonClientAreaMouseButtonDblClick:
        return "QMouseEvent";
    case QEvent::DragEnter:
        return "QDragEnterEvent";
    case QEvent::DragMove:
        return "QDragMoveEvent";
    case QEvent::Drop:
        return "QDropEvent";
    case QEvent::KeyPress:
    case QEvent::KeyRelease:
    case QEvent::ShortcutOverride:
        return "QKeyEvent";
    case QEvent::FocusIn:
    case QEvent::FocusOut:
    case QEvent::FocusAboutToChange:
        return "QFocusEvent";
    case QEvent::ChildAdded:
    case QEvent::ChildPolished:
    case QEvent::ChildRemoved:
        return "QChildEvent";
    case QEvent::Paint:
        return "QPaintEvent";
    case QEvent::Move:
        return "QMoveEvent";
    case QEvent::Resize:
        return "QResizeEvent";
    case QEvent::Show:
        return "QShowEvent";
    case QEvent::Hide:
        return "QHideEvent";
    case QEvent::Enter:
        return "QEnterEvent";
    case QEvent::Close:
        return "QCloseEvent";
    case QEvent::FileOpen:
        return "QFileOpenEvent";
#ifndef QT_NO_GESTURES
    case QEvent::NativeGesture:
        return "QNativeGestureEvent";
    case QEvent::Gesture:
    case QEvent::GestureOverride:
        return "QGestureEvent";
#endif
    case QEvent::HoverEnter:
    case QEvent::HoverLeave:
    case QEvent::HoverMove:
        return "QHoverEvent";
    case QEvent::TabletEnterProximity:
    case QEvent::TabletLeaveProximity:
    case QEvent::TabletPress:
    case QEvent::TabletMove:
    case QEvent::TabletRelease:
        return "QTabletEvent";
    case QEvent::StatusTip:
        return "QStatusTipEvent";
    case QEvent::ToolTip:
        return "QHelpEvent";
    case QEvent::WindowStateChange:
        return "QWindowStateChangeEvent";
    case QEvent::Wheel:
        return "QWheelEvent";
    case QEvent::TouchBegin:
    case QEvent::TouchUpdate:
    case QEvent::TouchEnd:
        return "QTouchEvent";
    case QEvent::Shortcut:
        return "QShortcutEvent";
    case QEvent::InputMethod:
        return "QInputMethodEvent";
    case QEvent::InputMethodQuery:
        return "QInputMethodQueryEvent";
    case QEvent::OrientationChange:
        return "QScreenOrientationChangeEvent";
    case QEvent::ScrollPrepare:
        return "QScrollPrepareEvent";
    case QEvent::Scroll:
        return "QScrollEvent";
    case QEvent::GraphicsSceneMouseMove:
    case QEvent::GraphicsSceneMousePress:
    case QEvent::GraphicsSceneMouseRelease:
    case QEvent::GraphicsSceneMouseDoubleClick:
        return "QGraphicsSceneMouseEvent";
    case QEvent::GraphicsSceneContextMenu:
    case QEvent::GraphicsSceneHoverEnter:
    case QEvent::GraphicsSceneHoverMove:
    case QEvent::GraphicsSceneHoverLeave:
    case QEvent::GraphicsSceneHelp:
    case QEvent::GraphicsSceneDragEnter:
    case QEvent::GraphicsSceneDragMove:
    case QEvent::GraphicsSceneDragLeave:
    case QEvent::GraphicsSceneDrop:
    case QEvent::GraphicsSceneWheel:
        return "QGraphicsSceneEvent";
    case QEvent::Timer:
        return "QTimerEvent";
    case QEvent::PlatformSurface:
        return "QPlatformSurfaceEvent";
    default:
        break;
    }
    return "QEvent";
}